

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::TestBody
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *in_R9;
  Amount AVar4;
  AssertionResult gtest_ar__4;
  AssertHelper local_630;
  uint32_t index;
  AssertionResult gtest_ar_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  ConfidentialAssetId asset;
  AssertHelper local_598;
  OutPoint outpoint;
  Address out1_addr;
  ConfidentialTransactionContext txc;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  std::__cxx11::string::string
            ((string *)&addr,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             (allocator *)&out1_addr);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&ct_addr,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&addr,&ct_addr);
  std::__cxx11::string::string
            ((string *)&asset,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&gtest_ar_2);
  cfd::core::Txid::Txid((Txid *)&out1_addr,(string *)&asset);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&out1_addr,2);
  cfd::core::Txid::~Txid((Txid *)&out1_addr);
  std::__cxx11::string::~string((string *)&asset);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&indexes);
  cfd::core::Txid::Txid((Txid *)&asset,(string *)&gtest_ar_2);
  cfd::core::OutPoint::OutPoint((OutPoint *)&out1_addr,(Txid *)&asset,0);
  cfd::ConfidentialTransactionContext::AddTxIn(&txc,(OutPoint *)&out1_addr);
  cfd::core::Txid::~Txid((Txid *)&out1_addr);
  cfd::core::Txid::~Txid((Txid *)&asset);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  cfd::ConfidentialTransactionContext::AddTxIn(&txc,&outpoint);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  gtest_ar_2._0_8_ = AVar4.amount_;
  gtest_ar_2.message_.ptr_._0_1_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&asset,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&indexes);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&out1_addr,(string *)&asset);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&txc.super_ConfidentialTransaction,(Amount *)&gtest_ar_2,
             (ConfidentialAssetId *)&out1_addr);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&out1_addr);
  std::__cxx11::string::~string((string *)&asset);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  gtest_ar_2._0_8_ = AVar4.amount_;
  gtest_ar_2.message_.ptr_._0_1_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&asset,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&indexes);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&out1_addr,(string *)&asset);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,&ct_addr,(Amount *)&gtest_ar_2,(ConfidentialAssetId *)&out1_addr,false);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&out1_addr);
  std::__cxx11::string::~string((string *)&asset);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&out1_addr,(AbstractTransaction *)&txc);
  testing::internal::CmpHelperSTREQ
            ((internal *)&asset,"txc.GetHex().c_str()",
             "\"020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000\""
             ,(char *)out1_addr._0_8_,
             "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
            );
  std::__cxx11::string::~string((string *)&out1_addr);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&out1_addr);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&out1_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out1_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&out1_addr,&addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&asset,"addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",(char *)out1_addr._0_8_,
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  std::__cxx11::string::~string((string *)&out1_addr);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&out1_addr);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&out1_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&out1_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::ConfidentialTransactionContext::GetTxOutAddress(&out1_addr,&txc,1,kElementsRegtest,false);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&asset,&out1_addr);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"out1_addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",
             (char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                              (char)asset._vptr_ConfidentialAssetId),
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  std::__cxx11::string::~string((string *)&asset);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  index = 0;
  bVar1 = cfd::ConfidentialTransactionContext::IsFindTxIn(&txc,&outpoint,&index);
  gtest_ar_2.success_ = bVar1;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&indexes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&asset,(internal *)&gtest_ar_2,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x68,(char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                                      (char)asset._vptr_ConfidentialAssetId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&asset);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&asset,"index","1",&index,(int *)&gtest_ar_2);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (&txc,&addr,&index,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  gtest_ar_2.success_ = bVar1;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&indexes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&asset,(internal *)&gtest_ar_2,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6a,(char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                                      (char)asset._vptr_ConfidentialAssetId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&asset);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&asset,"index","1",&index,(int *)&gtest_ar_2);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::Script::Script((Script *)&asset);
  bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (&txc,(Script *)&asset,&index,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  gtest_ar_2.success_ = bVar1;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::Script::~Script((Script *)&asset);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&asset,(internal *)&gtest_ar_2,
               (AssertionResult *)"txc.IsFindTxOut(Script(), &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6c,(char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                                      (char)asset._vptr_ConfidentialAssetId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&asset);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_8_ = gtest_ar_2._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&asset,"index","0",&index,(int *)&gtest_ar_2);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  uVar2 = cfd::ConfidentialTransactionContext::GetTxOutIndex(&txc,&addr);
  gtest_ar_2._0_4_ = uVar2;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&asset,"txc.GetTxOutIndex(addr)","1",(uint *)&gtest_ar_2,(int *)&indexes);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  bVar1 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(&txc,&index);
  gtest_ar_2.success_ = bVar1;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&indexes);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&asset,(internal *)&gtest_ar_2,
               (AssertionResult *)"txc.IsFindFeeTxOut(&index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6f,(char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                                      (char)asset._vptr_ConfidentialAssetId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&asset);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2._0_8_ = gtest_ar_2._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&asset,"index","0",&index,(int *)&gtest_ar_2);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&indexes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&indexes,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&indexes);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset);
  AVar4 = cfd::ConfidentialTransactionContext::GetFeeAmount(&txc,&asset);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)AVar4.amount_;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,AVar4.ignore_check_);
  gtest_ar__4._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&indexes);
  local_630.data_._0_4_ = 0x1c84;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"txc.GetFeeAmount(&asset).GetSatoshiValue()","7300",
             (long *)&gtest_ar__4,(int *)&local_630);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&indexes);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&indexes);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&indexes);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar_2,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&indexes,"asset.GetHex().c_str()",
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",
             (char *)gtest_ar_2._0_8_,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if ((char)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  gtest_ar__4._0_8_ = AVar4.amount_;
  gtest_ar__4.message_.ptr_._0_1_ = AVar4.ignore_check_;
  std::__cxx11::string::string
            ((string *)&indexes,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&local_630);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_2,(string *)&indexes);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,&ct_addr,(Amount *)&gtest_ar__4,(ConfidentialAssetId *)&gtest_ar_2,false);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&indexes);
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut(&txc,&addr,&index,&indexes);
  gtest_ar__4.success_ = bVar1;
  gtest_ar__4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&gtest_ar__4,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index, &indexes)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7a,(char *)gtest_ar_2._0_8_);
    testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_630);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__4.message_);
  gtest_ar__4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar_2,"index","1",&index,(int *)&gtest_ar__4);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_630,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar__4._0_8_ =
       (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  local_630.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_2,"indexes.size()","2",(unsigned_long *)&gtest_ar__4,
             (int *)&local_630);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_630,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  if ((long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    gtest_ar__4._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar_2,"indexes[0]","1",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)&gtest_ar__4);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__4);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_630,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_630,(Message *)&gtest_ar__4);
      testing::internal::AssertHelper::~AssertHelper(&local_630);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    gtest_ar__4._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar_2,"indexes[1]","2",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1,(int *)&gtest_ar__4);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__4);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_630,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_630,(Message *)&gtest_ar__4);
      testing::internal::AssertHelper::~AssertHelper(&local_630);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__4);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::Address::~Address(&out1_addr);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  cfd::core::Address::~Address(&addr);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}